

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnTranslatedPalCommand::Execute
          (DrawColumnTranslatedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  int core_skip;
  int iVar8;
  uint8_t *puVar9;
  int pass_skip;
  uint uVar10;
  int iVar11;
  
  iVar8 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar1 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar11 = thread->pass_end_y - iVar8;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  if (iVar1 < iVar11) {
    iVar11 = iVar1;
  }
  uVar10 = thread->pass_start_y - iVar8;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  iVar1 = thread->num_cores;
  iVar8 = (iVar1 - (int)((iVar8 + uVar10) - thread->core) % iVar1) % iVar1;
  uVar6 = (long)(int)((~uVar10 + iVar1 + iVar11) - iVar8) / (long)iVar1;
  uVar7 = uVar6 & 0xffffffff;
  if (0 < (int)uVar6) {
    iVar11 = (this->super_PalColumnCommand)._pitch;
    iVar2 = (this->super_PalColumnCommand)._iscale;
    iVar8 = iVar8 + uVar10;
    puVar9 = (this->super_PalColumnCommand)._dest + iVar11 * iVar8;
    iVar8 = iVar8 * iVar2 + (this->super_PalColumnCommand)._texturefrac;
    puVar3 = (this->super_PalColumnCommand)._colormap;
    puVar4 = (this->super_PalColumnCommand)._translation;
    puVar5 = (this->super_PalColumnCommand)._source;
    do {
      *puVar9 = puVar3[puVar4[puVar5[iVar8 >> 0x10]]];
      puVar9 = puVar9 + iVar11 * iVar1;
      iVar8 = iVar8 + iVar2 * iVar1;
      uVar10 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar10;
    } while (uVar10 != 0);
  }
  return;
}

Assistant:

void DrawColumnTranslatedPalCommand::Execute(DrawerThread *thread)
	{
		int 				count;
		uint8_t*				dest;
		fixed_t 			frac;
		fixed_t 			fracstep;

		count = _count;

		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		// [RH] Local copies of global vars to improve compiler optimizations
		const uint8_t *colormap = _colormap;
		const uint8_t *translation = _translation;
		const uint8_t *source = _source;

		do
		{
			*dest = colormap[translation[source[frac >> FRACBITS]]];
			dest += pitch;

			frac += fracstep;
		} while (--count);
	}